

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O0

bool tinyusdz::io::UnmapFile(MMapFileHandle *handle,string *err)

{
  int iVar1;
  int ret;
  string *err_local;
  MMapFileHandle *handle_local;
  
  if ((handle->addr == (uint8_t *)0x0) || (handle->size == 0)) {
    handle_local._7_1_ = false;
  }
  else {
    iVar1 = munmap(handle->addr,handle->size);
    if ((iVar1 != 0) && (err != (string *)0x0)) {
      std::__cxx11::string::operator+=((string *)err,"warning: munmap failed.");
    }
    handle_local._7_1_ = true;
  }
  return handle_local._7_1_;
}

Assistant:

bool UnmapFile(const MMapFileHandle &handle, std::string *err) {
#if TINYUSDZ_MMAP_SUPPORTED
#if defined(_WIN32)
  if (handle.addr && handle.size) {
    if (!UnmapViewOfFile(handle.addr)) {
      if (err) {
        (*err) += "warning: UnmapViewOfFile failed: " +
                  llama_format_win_err(GetLastError());
      }
      // May ok for now
      return true;
    }
  }

  return false;
#else  // !WIN32
  if (handle.addr && handle.size) {
    int ret = munmap(reinterpret_cast<void *>(handle.addr), size_t(handle.size));
    if (ret != 0) { // 0 = success
      if (err) {
        (*err) += "warning: munmap failed.";
      }
    }
    // ignore return code for now
    return true;
  }
  return false;
#endif
#else  // !TINYUSDZ_MMAP_SUPPORTED
  (void)handle;
  (void)err;
  return false;
#endif
}